

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void google::protobuf::TestCtorAndDtorTraits<false,false>
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *def,vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *copy,
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *with_int)

{
  bool bVar1;
  int iVar2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this;
  char *pcVar3;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *container;
  ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_> *matcher;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *container_00;
  ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_> *matcher_00;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *container_01;
  ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_> *matcher_01;
  AssertHelper local_330;
  Message local_328;
  ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_> local_320;
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_308;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_2d8 [8];
  Arena arena_2;
  Message local_228;
  ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_> local_220;
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_208;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_1;
  Arena arena_1;
  TraitsProber p;
  Message local_120;
  ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_> local_118;
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_100;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  Arena arena;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *with_int_local;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *copy_local;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *def_local;
  
  if ((TestCtorAndDtorTraits<false,false>(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>)
       ::actions == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestCtorAndDtorTraits<false,false>(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>)
                                   ::actions), iVar2 != 0)) {
    this = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)operator_new(0x18);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector(this);
    TestCtorAndDtorTraits<false,_false>::actions = this;
    __cxa_guard_release(&TestCtorAndDtorTraits<false,false>(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>)
                         ::actions);
  }
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::clear(TestCtorAndDtorTraits<false,_false>::actions);
  Arena::Arena((Arena *)&gtest_ar.message_);
  Arena::
  Create<google::protobuf::TestCtorAndDtorTraits<false,false>(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>)::TraitsProber>
            ((Arena *)&gtest_ar.message_);
  Arena::~Arena((Arena *)&gtest_ar.message_);
  testing::
  ElementsAreArray<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
            (&local_118,(testing *)def,container);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,std::char_traits<char>>>>
            (&local_100,(internal *)&local_118,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,std::char_traits<char>>>>
  ::operator()(local_e8,(char *)&local_100,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)"actions");
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_100);
  testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_>
  ::~ElementsAreArrayMatcher(&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p.super_Message.super_MessageLite._internal_metadata_,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0xe2,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&p.super_Message.super_MessageLite._internal_metadata_,&local_120);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&p.super_Message.super_MessageLite._internal_metadata_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  TestCtorAndDtorTraits<false,_false>::TraitsProber::TraitsProber
            ((TraitsProber *)&arena_1.impl_.first_arena_.cached_blocks_);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::clear(TestCtorAndDtorTraits<false,_false>::actions);
  Arena::Arena((Arena *)&gtest_ar_1.message_);
  Arena::
  Create<google::protobuf::TestCtorAndDtorTraits<false,false>(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>)::TraitsProber,google::protobuf::TestCtorAndDtorTraits<false,false>(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>)::TraitsProber_const&>
            ((Arena *)&gtest_ar_1.message_,
             (TraitsProber *)&arena_1.impl_.first_arena_.cached_blocks_);
  Arena::~Arena((Arena *)&gtest_ar_1.message_);
  testing::
  ElementsAreArray<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
            (&local_220,(testing *)copy,container_00);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,std::char_traits<char>>>>
            (&local_208,(internal *)&local_220,matcher_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,std::char_traits<char>>>>
  ::operator()(local_1f0,(char *)&local_208,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)"actions");
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_208);
  testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_>
  ::~ElementsAreArrayMatcher(&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&arena_2.impl_.first_arena_.cached_blocks_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&arena_2.impl_.first_arena_.cached_blocks_,&local_228);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&arena_2.impl_.first_arena_.cached_blocks_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::clear(TestCtorAndDtorTraits<false,_false>::actions);
  Arena::Arena((Arena *)local_2d8);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x11;
  Arena::
  Create<google::protobuf::TestCtorAndDtorTraits<false,false>(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>)::TraitsProber,int>
            ((Arena *)local_2d8,
             (int *)((long)&gtest_ar_2.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  Arena::~Arena((Arena *)local_2d8);
  testing::
  ElementsAreArray<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
            (&local_320,(testing *)with_int,container_01);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,std::char_traits<char>>>>
            (&local_308,(internal *)&local_320,matcher_01);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,std::char_traits<char>>>>
  ::operator()(local_2f0,(char *)&local_308,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)"actions");
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_308);
  testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_>
  ::~ElementsAreArrayMatcher(&local_320);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0xf1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  TestCtorAndDtorTraits<false,_false>::TraitsProber::~TraitsProber
            ((TraitsProber *)&arena_1.impl_.first_arena_.cached_blocks_);
  return;
}

Assistant:

void TestCtorAndDtorTraits(std::vector<absl::string_view> def,
                           std::vector<absl::string_view> copy,
                           std::vector<absl::string_view> with_int) {
  static auto& actions = *new std::vector<absl::string_view>;
  struct TraitsProber
      : std::conditional_t<arena_ctor, ArenaCtorBase, EmptyBase<0>>,
        std::conditional_t<arena_dtor, ArenaDtorBase, EmptyBase<1>>,
        Message {
    TraitsProber() : Message(nullptr, nullptr) { actions.push_back("()"); }
    TraitsProber(const TraitsProber&) : Message(nullptr, nullptr) {
      actions.push_back("(const T&)");
    }
    explicit TraitsProber(int) : Message(nullptr, nullptr) {
      actions.push_back("(int)");
    }
    explicit TraitsProber(Arena* arena) : Message(nullptr, nullptr) {
      actions.push_back("(Arena)");
    }
    TraitsProber(Arena* arena, const TraitsProber&)
        : Message(nullptr, nullptr) {
      actions.push_back("(Arena, const T&)");
    }
    TraitsProber(Arena* arena, int) : Message(nullptr, nullptr) {
      actions.push_back("(Arena, int)");
    }
    ~TraitsProber() { actions.push_back("~()"); }

    TraitsProber* New(Arena*) const {
      ABSL_LOG(FATAL);
      return nullptr;
    }
    const internal::ClassData* GetClassData() const PROTOBUF_FINAL {
      ABSL_LOG(FATAL);
      return nullptr;
    }
  };

  static_assert(
      !arena_ctor || Arena::is_arena_constructable<TraitsProber>::value, "");
  static_assert(
      !arena_dtor || Arena::is_destructor_skippable<TraitsProber>::value, "");

  {
    actions.clear();
    Arena arena;
    Arena::Create<TraitsProber>(&arena);
  }
  EXPECT_THAT(actions, ElementsAreArray(def));

  const TraitsProber p;
  {
    actions.clear();
    Arena arena;
    Arena::Create<TraitsProber>(&arena, p);
  }
  EXPECT_THAT(actions, ElementsAreArray(copy));

  {
    actions.clear();
    Arena arena;
    Arena::Create<TraitsProber>(&arena, 17);
  }
  EXPECT_THAT(actions, ElementsAreArray(with_int));
}